

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O1

int adjust_boost_bits_for_target_level
              (AV1_COMP *cpi,RATE_CONTROL *rc,int bits_assigned,int64_t group_bits,int frame_type)

{
  byte level_index;
  SequenceHeader *pSVar1;
  AV1_PRIMARY *pAVar2;
  int iVar3;
  long lVar4;
  int frame_count;
  uint uVar5;
  double dVar6;
  
  pSVar1 = (cpi->common).seq_params;
  if (-1 < pSVar1->operating_points_cnt_minus_1) {
    pAVar2 = cpi->ppi;
    uVar5 = 1 << ((char)(cpi->common).spatial_layer_id + 8U & 0x1f) |
            1 << ((byte)(cpi->common).temporal_layer_id & 0x1f);
    lVar4 = -1;
    do {
      if (((pSVar1->operating_point_idc[lVar4 + 1] == 0) ||
          ((pSVar1->operating_point_idc[lVar4 + 1] & uVar5) == uVar5)) &&
         (level_index = (cpi->ppi->level_params).target_seq_level_idx[lVar4 + 1], level_index < 0x1c
         )) {
        dVar6 = av1_get_max_bitrate_for_level(level_index,(uint)pSVar1->tier[0],pSVar1->profile);
        iVar3 = (int)(dVar6 / cpi->framerate);
        if (frame_type == 0) {
          iVar3 = iVar3 * 8;
          if (iVar3 < bits_assigned) {
            frame_count = rc->frames_to_key + -1;
            iVar3 = (int)(((double)iVar3 * (double)frame_count * 100.0) /
                         (double)(group_bits - iVar3));
            (pAVar2->p_rc).kf_boost = iVar3;
            goto LAB_001f7a3f;
          }
        }
        else {
          iVar3 = iVar3 * 4;
          if (iVar3 < bits_assigned) {
            frame_count = (pAVar2->p_rc).baseline_gf_interval;
            iVar3 = (int)(((double)iVar3 * (double)frame_count * 100.0) /
                         (double)(group_bits - iVar3));
            (pAVar2->p_rc).gfu_boost = iVar3;
LAB_001f7a3f:
            bits_assigned = calculate_boost_bits(frame_count,iVar3,group_bits);
          }
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pSVar1->operating_points_cnt_minus_1);
  }
  return bits_assigned;
}

Assistant:

static int adjust_boost_bits_for_target_level(const AV1_COMP *const cpi,
                                              RATE_CONTROL *const rc,
                                              int bits_assigned,
                                              int64_t group_bits,
                                              int frame_type) {
  const AV1_COMMON *const cm = &cpi->common;
  const SequenceHeader *const seq_params = cm->seq_params;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const int temporal_layer_id = cm->temporal_layer_id;
  const int spatial_layer_id = cm->spatial_layer_id;
  for (int index = 0; index < seq_params->operating_points_cnt_minus_1 + 1;
       ++index) {
    if (!is_in_operating_point(seq_params->operating_point_idc[index],
                               temporal_layer_id, spatial_layer_id)) {
      continue;
    }

    const AV1_LEVEL target_level =
        cpi->ppi->level_params.target_seq_level_idx[index];
    if (target_level >= SEQ_LEVELS) continue;

    assert(is_valid_seq_level_idx(target_level));

    const double level_bitrate_limit = av1_get_max_bitrate_for_level(
        target_level, seq_params->tier[0], seq_params->profile);
    const int target_bits_per_frame =
        (int)(level_bitrate_limit / cpi->framerate);
    if (frame_type == 0) {
      // Maximum bits for keyframe is 8 times the target_bits_per_frame.
      const int level_enforced_max_kf_bits = target_bits_per_frame * 8;
      if (bits_assigned > level_enforced_max_kf_bits) {
        const int frames = rc->frames_to_key - 1;
        p_rc->kf_boost = calculate_boost_factor(
            frames, level_enforced_max_kf_bits, group_bits);
        bits_assigned =
            calculate_boost_bits(frames, p_rc->kf_boost, group_bits);
      }
    } else if (frame_type == 1) {
      // Maximum bits for arf is 4 times the target_bits_per_frame.
      const int level_enforced_max_arf_bits = target_bits_per_frame * 4;
      if (bits_assigned > level_enforced_max_arf_bits) {
        p_rc->gfu_boost =
            calculate_boost_factor(p_rc->baseline_gf_interval,
                                   level_enforced_max_arf_bits, group_bits);
        bits_assigned = calculate_boost_bits(p_rc->baseline_gf_interval,
                                             p_rc->gfu_boost, group_bits);
      }
    } else {
      assert(0);
    }
  }

  return bits_assigned;
}